

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testRNNLayer2(void)

{
  pointer pcVar1;
  WeightParams *pWVar2;
  bool bVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  TypeUnion this;
  Type *this_00;
  LayerUnion this_01;
  ActivationParametricSoftplus *this_02;
  WeightParams *pWVar8;
  ostream *poVar9;
  int iVar10;
  Result res;
  Model m1;
  undefined1 local_80 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Model local_58;
  
  CoreML::Specification::Model::Model(&local_58);
  if (local_58.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_58.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_58.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_80 + 0x10;
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
    pFVar6 = pTVar5->type_;
    if (pFVar6 == (FeatureType *)0x0) {
      pFVar6 = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(pFVar6);
      pTVar5->type_ = pFVar6;
    }
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar7 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  iVar10 = (pAVar7->shape_).current_size_;
  if (iVar10 == (pAVar7->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar7->shape_,iVar10 + 1);
    iVar10 = (pAVar7->shape_).current_size_;
  }
  (pAVar7->shape_).current_size_ = iVar10 + 1;
  ((pAVar7->shape_).rep_)->elements[iVar10] = 1;
  if (local_58.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_58.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_58.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  if (local_58._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_58);
    local_58._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_58.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_58.Type_.pipeline_)->models_,(Type *)0x0);
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"rnn","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_00->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"hin");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"hout");
  if (this_00->_oneof_case_[0] == 400) {
    this_01 = this_00->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 400;
    this_01.convolution_ = (ConvolutionLayerParams *)operator_new(0x48);
    CoreML::Specification::SimpleRecurrentLayerParams::SimpleRecurrentLayerParams
              (this_01.simplerecurrent_);
    (this_00->layer_).simplerecurrent_ = (SimpleRecurrentLayerParams *)this_01;
  }
  *(undefined2 *)&((this_01.convolution_)->dilationfactor_).current_size_ = 0;
  (this_01.batchnorm_)->channels_ = 1;
  (this_01.simplerecurrent_)->outputvectorsize_ = 2;
  this_02 = ((this_01.activation_)->NonlinearityType_).parametricsoftplus_;
  if (this_02 == (ActivationParametricSoftplus *)0x0) {
    this_02 = (ActivationParametricSoftplus *)operator_new(0x20);
    CoreML::Specification::ActivationParams::ActivationParams((ActivationParams *)this_02);
    ((this_01.activation_)->NonlinearityType_).parametricsoftplus_ = this_02;
  }
  if (*(int *)((long)&this_02->beta_ + 4) != 0x28) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType((ActivationParams *)this_02);
    *(undefined4 *)((long)&this_02->beta_ + 4) = 0x28;
    pWVar8 = (WeightParams *)operator_new(0x18);
    CoreML::Specification::ActivationSigmoid::ActivationSigmoid((ActivationSigmoid *)pWVar8);
    this_02->alpha_ = pWVar8;
  }
  pWVar8 = (this_01.innerproduct_)->bias_;
  if (pWVar8 == (WeightParams *)0x0) {
    pWVar8 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar8);
    (this_01.innerproduct_)->bias_ = pWVar8;
  }
  iVar10 = (pWVar8->floatvalue_).current_size_;
  if (iVar10 == (pWVar8->floatvalue_).total_size_) {
    google::protobuf::RepeatedField<float>::Reserve(&pWVar8->floatvalue_,iVar10 + 1);
    iVar10 = (pWVar8->floatvalue_).current_size_;
    pWVar2 = (this_01.innerproduct_)->bias_;
    (pWVar8->floatvalue_).current_size_ = iVar10 + 1;
    ((pWVar8->floatvalue_).rep_)->elements[iVar10] = 1.0;
    pWVar8 = pWVar2;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar8 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar8);
      (this_01.innerproduct_)->bias_ = pWVar8;
    }
  }
  else {
    (pWVar8->floatvalue_).current_size_ = iVar10 + 1;
    ((pWVar8->floatvalue_).rep_)->elements[iVar10] = 1.0;
  }
  iVar10 = (pWVar8->floatvalue_).current_size_;
  if (iVar10 == (pWVar8->floatvalue_).total_size_) {
    google::protobuf::RepeatedField<float>::Reserve(&pWVar8->floatvalue_,iVar10 + 1);
    iVar10 = (pWVar8->floatvalue_).current_size_;
  }
  (pWVar8->floatvalue_).current_size_ = iVar10 + 1;
  ((pWVar8->floatvalue_).rep_)->elements[iVar10] = 1.0;
  pWVar8 = (this_01.batchnorm_)->mean_;
  if (pWVar8 == (WeightParams *)0x0) {
    pWVar8 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar8);
    (this_01.batchnorm_)->mean_ = pWVar8;
  }
  iVar10 = (pWVar8->floatvalue_).current_size_;
  if (iVar10 == (pWVar8->floatvalue_).total_size_) {
    google::protobuf::RepeatedField<float>::Reserve(&pWVar8->floatvalue_,iVar10 + 1);
    iVar10 = (pWVar8->floatvalue_).current_size_;
    pWVar2 = (this_01.batchnorm_)->mean_;
    (pWVar8->floatvalue_).current_size_ = iVar10 + 1;
    ((pWVar8->floatvalue_).rep_)->elements[iVar10] = 1.0;
    pWVar8 = pWVar2;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar8 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar8);
      (this_01.batchnorm_)->mean_ = pWVar8;
    }
  }
  else {
    (pWVar8->floatvalue_).current_size_ = iVar10 + 1;
    ((pWVar8->floatvalue_).rep_)->elements[iVar10] = 1.0;
  }
  iVar10 = (pWVar8->floatvalue_).current_size_;
  if (iVar10 == (pWVar8->floatvalue_).total_size_) {
    google::protobuf::RepeatedField<float>::Reserve(&pWVar8->floatvalue_,iVar10 + 1);
    iVar10 = (pWVar8->floatvalue_).current_size_;
    pWVar2 = (this_01.batchnorm_)->mean_;
    (pWVar8->floatvalue_).current_size_ = iVar10 + 1;
    ((pWVar8->floatvalue_).rep_)->elements[iVar10] = 1.0;
    pWVar8 = pWVar2;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar8 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar8);
      (this_01.batchnorm_)->mean_ = pWVar8;
    }
  }
  else {
    (pWVar8->floatvalue_).current_size_ = iVar10 + 1;
    ((pWVar8->floatvalue_).rep_)->elements[iVar10] = 1.0;
  }
  iVar10 = (pWVar8->floatvalue_).current_size_;
  if (iVar10 == (pWVar8->floatvalue_).total_size_) {
    google::protobuf::RepeatedField<float>::Reserve(&pWVar8->floatvalue_,iVar10 + 1);
    iVar10 = (pWVar8->floatvalue_).current_size_;
    pWVar2 = (this_01.batchnorm_)->mean_;
    (pWVar8->floatvalue_).current_size_ = iVar10 + 1;
    ((pWVar8->floatvalue_).rep_)->elements[iVar10] = 1.0;
    pWVar8 = pWVar2;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar8 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar8);
      (this_01.batchnorm_)->mean_ = pWVar8;
    }
  }
  else {
    (pWVar8->floatvalue_).current_size_ = iVar10 + 1;
    ((pWVar8->floatvalue_).rep_)->elements[iVar10] = 1.0;
  }
  iVar10 = (pWVar8->floatvalue_).current_size_;
  if (iVar10 == (pWVar8->floatvalue_).total_size_) {
    google::protobuf::RepeatedField<float>::Reserve(&pWVar8->floatvalue_,iVar10 + 1);
    iVar10 = (pWVar8->floatvalue_).current_size_;
  }
  (pWVar8->floatvalue_).current_size_ = iVar10 + 1;
  ((pWVar8->floatvalue_).rep_)->elements[iVar10] = 1.0;
  CoreML::validate<(MLModelType)500>((Result *)local_80,&local_58);
  bVar3 = CoreML::Result::good((Result *)local_80);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x344);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._8_8_ != &local_68) {
    operator_delete((void *)local_80._8_8_,local_68._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_58);
  return (uint)bVar3;
}

Assistant:

int testRNNLayer2() {

    Specification::Model m1;

    // recurrent layers don't appear in the interface
    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");
    out->mutable_type()->mutable_multiarraytype();

    auto *nn = m1.mutable_neuralnetwork();
    Specification::NeuralNetworkLayer *layer = nn->add_layers();
    layer->set_name("rnn");
    layer->add_input("input");
    layer->add_input("hin");

    layer->add_output("output");
    layer->add_output("hout");

    Specification::SimpleRecurrentLayerParams *params = layer->mutable_simplerecurrent();
    params->set_hasbiasvector(false);
    params->set_sequenceoutput(false);
    params->set_inputvectorsize(1);
    params->set_outputvectorsize(2);
    params->mutable_activation()->mutable_sigmoid();

    params->mutable_weightmatrix()->add_floatvalue(1.0);
    params->mutable_weightmatrix()->add_floatvalue(1.0);

    params->mutable_recursionmatrix()->add_floatvalue(1.0);
    params->mutable_recursionmatrix()->add_floatvalue(1.0);
    params->mutable_recursionmatrix()->add_floatvalue(1.0);
    params->mutable_recursionmatrix()->add_floatvalue(1.0);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);

    return 0;

}